

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLineBspline.cpp
# Opt level: O1

void __thiscall
chrono::geometry::ChLineBspline::Derive(ChLineBspline *this,ChVector<double> *dir,double parU)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  uint uVar5;
  int i;
  undefined8 *puVar6;
  long cols;
  double *pdVar7;
  ulong uVar8;
  ChMatrixDynamic<> NdN;
  DenseStorage<double,__1,__1,__1,_1> local_48;
  double local_28;
  
  if (this->closed == true) {
    parU = fmod(parU,1.0);
  }
  local_28 = ComputeKnotUfromU(this,parU);
  i = ChBasisToolsBspline::FindSpan(this->p,local_28,&this->knots);
  local_48.m_data = (double *)0x0;
  local_48.m_rows = 0;
  local_48.m_cols = 0;
  if ((long)this->p < -1) {
    __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                  ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x115,
                  "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, -1, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, -1, 1>]"
                 );
  }
  cols = (long)this->p + 1;
  if (((int)cols != 0) &&
     (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816(cols),0) < 2)) {
    puVar6 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar6 = std::ostream::_M_insert<bool>;
    __cxa_throw(puVar6,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize(&local_48,cols * 2,2,cols);
  ChBasisToolsBspline::BasisEvaluateDeriv
            (this->p,i,local_28,&this->knots,(ChMatrixDynamic<> *)&local_48);
  if (dir != (ChVector<double> *)&VNULL) {
    dir->m_data[0] = VNULL;
    dir->m_data[1] = DAT_00b90ac0;
    dir->m_data[2] = DAT_00b90ac8;
  }
  uVar5 = this->p;
  if (-1 < (int)uVar5) {
    if (local_48.m_rows < 2) {
LAB_0081e864:
      __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                    "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x16f,
                    "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, -1, 1>, 1>::operator()(Index, Index) [Derived = Eigen::Matrix<double, -1, -1, 1>, Level = 1]"
                   );
    }
    dVar1 = dir->m_data[2];
    dVar2 = dir->m_data[0];
    dVar3 = dir->m_data[1];
    pdVar7 = (this->points).
             super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
             ._M_impl.super__Vector_impl_data._M_start[(int)(i - uVar5)].m_data + 2;
    uVar8 = 0;
    do {
      if ((~(local_48.m_cols >> 0x3f) & local_48.m_cols) == uVar8) goto LAB_0081e864;
      dVar4 = local_48.m_data[local_48.m_cols + uVar8];
      dVar2 = dVar4 * ((ChVector<double> *)(pdVar7 + -2))->m_data[0] + dVar2;
      dVar3 = dVar4 * pdVar7[-1] + dVar3;
      dVar1 = dVar4 * *pdVar7 + dVar1;
      dir->m_data[0] = dVar2;
      dir->m_data[1] = dVar3;
      dir->m_data[2] = dVar1;
      uVar8 = uVar8 + 1;
      pdVar7 = pdVar7 + 3;
    } while ((ulong)uVar5 + 1 != uVar8);
  }
  if (local_48.m_data != (double *)0x0) {
    free((void *)local_48.m_data[-1]);
  }
  return;
}

Assistant:

void ChLineBspline::Derive(ChVector<>& dir, const double parU) const {
	double mU;
	if (this->closed)
		mU = fmod(parU, 1.0);
	else
		mU = parU;

    double u = ComputeKnotUfromU(mU);

    int spanU = ChBasisToolsBspline::FindSpan(this->p, u, this->knots);

    ChMatrixDynamic<> NdN(2, p + 1);  // basis on 1st row and their 1st derivatives on 2nd row
    ChBasisToolsBspline::BasisEvaluateDeriv(this->p, spanU, u, this->knots, NdN);

    dir = VNULL;
    int uind = spanU - p;
    for (int i = 0; i <= this->p; i++) {
        dir += points[uind + i] * NdN(1, i);
    }
}